

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O1

REF_STATUS ref_swap_conforming(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE ref_node;
  REF_GEOM pRVar1;
  REF_CELL ref_cell;
  uint uVar2;
  REF_STATUS RVar3;
  REF_STATUS ref_private_macro_code_rss;
  long lVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  REF_BOOL supported;
  REF_INT node3;
  REF_INT node2;
  REF_INT cell_to_swap [2];
  REF_BOOL cell1_support;
  REF_BOOL cell0_support;
  REF_INT ncell;
  REF_DBL normdev3;
  REF_DBL normdev2;
  REF_DBL normdev1;
  REF_DBL normdev0;
  REF_DBL area3;
  REF_DBL area2;
  REF_DBL uv_area3;
  REF_DBL uv_area2;
  REF_DBL sign_uv_area;
  REF_INT nodes [27];
  int local_194;
  uint *local_190;
  REF_GRID local_188;
  REF_GEOM local_180;
  REF_INT local_178;
  REF_INT local_174;
  REF_INT local_170;
  REF_INT local_16c;
  REF_INT local_168;
  int local_164;
  int local_160;
  int local_15c;
  double local_158;
  double local_150;
  double local_148;
  double local_138;
  double local_130;
  double local_128;
  double local_118;
  double local_110;
  double local_108;
  double local_f8;
  double local_f0;
  double local_e8;
  REF_CELL local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  local_d8 = ref_grid->cell[3];
  pRVar1 = ref_grid->geom;
  *allowed = 0;
  uVar2 = ref_swap_node23(ref_grid,node0,node1,&local_170,&local_174);
  ref_cell = local_d8;
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x207,
           "ref_swap_conforming",(ulong)uVar2,"other nodes");
    return uVar2;
  }
  local_190 = (uint *)allowed;
  local_188 = ref_grid;
  local_180 = pRVar1;
  local_178 = node1;
  uVar2 = ref_cell_list_with2(local_d8,node0,node1,2,&local_15c,&local_16c);
  pRVar1 = local_180;
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x20a,
           "ref_swap_conforming",(ulong)uVar2,"more then two");
    return uVar2;
  }
  lVar4 = (long)local_15c;
  if (lVar4 != 2) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x20b,
           "ref_swap_conforming","there should be two triangles for manifold",2,lVar4);
  }
  if (local_15c != 2) {
    return (uint)(lVar4 != 2);
  }
  uVar2 = ref_cell_nodes(ref_cell,local_16c,local_a8);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x20c,
           "ref_swap_conforming",(ulong)uVar2,"nodes");
    return uVar2;
  }
  uVar2 = ref_geom_tri_supported(pRVar1,local_a8,&local_160);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x20d,
           "ref_swap_conforming",(ulong)uVar2,"tri support");
    return uVar2;
  }
  uVar2 = ref_cell_nodes(ref_cell,local_168,local_a8);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x20e,
           "ref_swap_conforming",(ulong)uVar2,"nodes");
    return uVar2;
  }
  uVar2 = ref_geom_tri_supported(pRVar1,local_a8,&local_164);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x20f,
           "ref_swap_conforming",(ulong)uVar2,"tri support");
    return uVar2;
  }
  uVar2 = ref_cell_nodes(ref_cell,local_16c,local_a8);
  local_a8[0] = node0;
  if ((local_160 == 0) || (local_164 == 0)) {
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x212,
             "ref_swap_conforming",(ulong)uVar2,"nodes");
      return uVar2;
    }
    uVar2 = ref_node_tri_normal(ref_node,local_a8,&local_f8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x213,
             "ref_swap_conforming",(ulong)uVar2,"tri 0 normal");
      return uVar2;
    }
    uVar2 = ref_math_normalize(&local_f8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x214,
             "ref_swap_conforming",(ulong)uVar2,"triangle 0 has zero area");
      return uVar2;
    }
    uVar2 = ref_cell_nodes(ref_cell,local_168,local_a8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x215,
             "ref_swap_conforming",(ulong)uVar2,"nodes");
      return uVar2;
    }
    uVar2 = ref_node_tri_normal(ref_node,local_a8,&local_118);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x216,
             "ref_swap_conforming",(ulong)uVar2,"tri 1 normal");
      return uVar2;
    }
    uVar2 = ref_math_normalize(&local_118);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x217,
             "ref_swap_conforming",(ulong)uVar2,"triangle 1 has zero area");
      return uVar2;
    }
    if (ref_node->same_normal_tol <=
        local_e8 * local_108 + local_f8 * local_118 + local_f0 * local_110) {
      local_a8[1] = local_174;
      local_a8[2] = local_170;
      uVar2 = ref_node_tri_normal(ref_node,local_a8,&local_138);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               0x220,"ref_swap_conforming",(ulong)uVar2,"tri 2 normal");
        return uVar2;
      }
      local_a8[0] = local_178;
      local_a8[1] = local_170;
      local_a8[2] = local_174;
      uVar2 = ref_node_tri_normal(ref_node,local_a8,&local_158);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               0x224,"ref_swap_conforming",(ulong)uVar2,"tri 3 normal");
        return uVar2;
      }
      dVar6 = local_128 * local_128 + local_138 * local_138 + local_130 * local_130;
      dVar7 = local_148 * local_148 + local_158 * local_158 + local_150 * local_150;
      if (dVar7 <= dVar6) {
        dVar6 = dVar7;
      }
      dVar6 = dVar6 * 1e+20;
      if (dVar6 <= -dVar6) {
        dVar6 = -dVar6;
      }
      if (1.0 < dVar6) {
        uVar2 = ref_math_normalize(&local_138);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x22a,"ref_swap_conforming",(ulong)uVar2,"triangle 2 has zero area");
          return uVar2;
        }
        uVar2 = ref_math_normalize(&local_158);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x22b,"ref_swap_conforming",(ulong)uVar2,"triangle 3 has zero area");
          return uVar2;
        }
        if (ref_node->same_normal_tol <=
            local_128 * local_148 + local_138 * local_158 + local_130 * local_150)
        goto LAB_001ee0eb;
      }
    }
    *local_190 = 0;
  }
  else {
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x235,
             "ref_swap_conforming",(ulong)uVar2,"nodes tri0");
      return uVar2;
    }
    uVar2 = ref_geom_tri_norm_deviation(local_188,local_a8,&local_f8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x236,
             "ref_swap_conforming",(ulong)uVar2,"nd0");
      return uVar2;
    }
    uVar2 = ref_cell_nodes(ref_cell,local_168,local_a8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x237,
             "ref_swap_conforming",(ulong)uVar2,"nodes tri1");
      return uVar2;
    }
    uVar2 = ref_geom_tri_norm_deviation(local_188,local_a8,&local_118);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x238,
             "ref_swap_conforming",(ulong)uVar2,"nd1");
      return uVar2;
    }
    local_a8[1] = local_174;
    local_a8[2] = local_170;
    uVar2 = ref_geom_cell_tuv_supported(local_180,local_a8,2,&local_194);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x23d,
             "ref_swap_conforming",(ulong)uVar2,"allow a swap to");
      return uVar2;
    }
    if (local_194 == 0) {
      return 0;
    }
    RVar3 = ref_geom_tri_norm_deviation(local_188,local_a8,&local_138);
    if (RVar3 != 0) {
      return 0;
    }
    uVar2 = ref_geom_uv_area(local_180,local_a8,&local_b8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x241,
             "ref_swap_conforming",(ulong)uVar2,"uv area");
      return uVar2;
    }
    uVar2 = ref_node_tri_area(ref_node,local_a8,&local_c8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x242,
             "ref_swap_conforming",(ulong)uVar2,"area2");
      return uVar2;
    }
    local_a8[0] = local_178;
    local_a8[1] = local_170;
    local_a8[2] = local_174;
    uVar2 = ref_geom_cell_tuv_supported(local_180,local_a8,2,&local_194);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x247,
             "ref_swap_conforming",(ulong)uVar2,"allow a swap to");
      return uVar2;
    }
    if (local_194 == 0) {
      return 0;
    }
    RVar3 = ref_geom_tri_norm_deviation(local_188,local_a8,&local_158);
    if (RVar3 != 0) {
      return 0;
    }
    uVar2 = ref_geom_uv_area(local_180,local_a8,&local_c0);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x24b,
             "ref_swap_conforming",(ulong)uVar2,"uv area");
      return uVar2;
    }
    uVar2 = ref_node_tri_area(ref_node,local_a8,&local_d0);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x24c,
             "ref_swap_conforming",(ulong)uVar2,"area2");
      return uVar2;
    }
    dVar6 = local_138;
    if (local_158 <= local_138) {
      dVar6 = local_158;
    }
    if (local_118 <= local_f8) {
      local_f8 = local_118;
    }
    if (dVar6 <= local_f8) {
      if (dVar6 <= local_f8 * 0.9) goto LAB_001ee12f;
      dVar6 = local_188->adapt->post_min_normdev;
      bVar5 = false;
      if ((dVar6 < local_138) && (bVar5 = false, dVar6 < local_158)) goto LAB_001edc6f;
    }
    else {
LAB_001edc6f:
      if (local_c8 <= ref_node->min_volume) {
LAB_001ee12f:
        bVar5 = false;
      }
      else {
        bVar5 = ref_node->min_volume < local_d0;
      }
    }
    if (local_180->meshlink != (void *)0x0) {
      *local_190 = (uint)bVar5;
      return 0;
    }
    uVar2 = ref_geom_uv_area_sign(local_188,local_a8[ref_cell->node_per],&local_b0);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x260,
             "ref_swap_conforming",(ulong)uVar2,"uv area sign");
      return uVar2;
    }
    if ((bVar5 & ref_node->min_uv_area < local_b8 * local_b0) != 1) {
      return 0;
    }
    if (local_b0 * local_c0 <= ref_node->min_uv_area) {
      return 0;
    }
LAB_001ee0eb:
    *local_190 = 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_swap_conforming(REF_GRID ref_grid, REF_INT node0,
                                       REF_INT node1, REF_BOOL *allowed) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT ncell, cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node2, node3;
  REF_BOOL cell0_support, cell1_support;
  REF_DBL normdev0, normdev1, normdev2, normdev3;
  REF_DBL sign_uv_area, uv_area2, uv_area3, area2, area3;
  REF_BOOL normdev_allowed, uv_area_allowed;
  REF_BOOL supported;
  REF_DBL normal0[3], normal1[3], normal2[3], normal3[3], dot;

  *allowed = REF_FALSE;

  RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3), "other nodes");

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two");
  REIS(2, ncell, "there should be two triangles for manifold");
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes");
  RSS(ref_geom_tri_supported(ref_geom, nodes, &cell0_support), "tri support");
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes");
  RSS(ref_geom_tri_supported(ref_geom, nodes, &cell1_support), "tri support");

  if (!cell0_support || !cell1_support) {
    RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes");
    RSS(ref_node_tri_normal(ref_node, nodes, normal0), "tri 0 normal");
    RSS(ref_math_normalize(normal0), "triangle 0 has zero area");
    RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes");
    RSS(ref_node_tri_normal(ref_node, nodes, normal1), "tri 1 normal");
    RSS(ref_math_normalize(normal1), "triangle 1 has zero area");
    dot = ref_math_dot(normal0, normal1);
    if (dot < ref_node_same_normal_tol(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    nodes[0] = node0;
    nodes[1] = node3;
    nodes[2] = node2;
    RSS(ref_node_tri_normal(ref_node, nodes, normal2), "tri 2 normal");
    nodes[0] = node1;
    nodes[1] = node2;
    nodes[2] = node3;
    RSS(ref_node_tri_normal(ref_node, nodes, normal3), "tri 3 normal");
    dot = MIN(ref_math_dot(normal2, normal2), ref_math_dot(normal3, normal3));
    if (!ref_math_divisible(1.0, dot)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    RSS(ref_math_normalize(normal2), "triangle 2 has zero area");
    RSS(ref_math_normalize(normal3), "triangle 3 has zero area");
    dot = ref_math_dot(normal2, normal3);
    if (dot < ref_node_same_normal_tol(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");
  RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev0), "nd0");
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes tri1");
  RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev1), "nd1");
  nodes[0] = node0;
  nodes[1] = node3;
  nodes[2] = node2;
  RSS(ref_geom_cell_tuv_supported(ref_geom, nodes, REF_GEOM_FACE, &supported),
      "allow a swap to");
  if (!supported) return REF_SUCCESS;
  if (REF_SUCCESS != ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev2))
    return REF_SUCCESS;
  RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area2), "uv area");
  RSS(ref_node_tri_area(ref_node, nodes, &area2), "area2");
  nodes[0] = node1;
  nodes[1] = node2;
  nodes[2] = node3;
  RSS(ref_geom_cell_tuv_supported(ref_geom, nodes, REF_GEOM_FACE, &supported),
      "allow a swap to");
  if (!supported) return REF_SUCCESS;
  if (REF_SUCCESS != ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev3))
    return REF_SUCCESS;
  RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area3), "uv area");
  RSS(ref_node_tri_area(ref_node, nodes, &area3), "area2");

  normdev_allowed =
      ((MIN(normdev2, normdev3) > MIN(normdev0, normdev1)) ||
       ((MIN(normdev2, normdev3) > 0.9 * MIN(normdev0, normdev1)) &&
        (normdev2 > ref_grid_adapt(ref_grid, post_min_normdev) &&
         normdev3 > ref_grid_adapt(ref_grid, post_min_normdev))));

  normdev_allowed = normdev_allowed &&
                    (area2 > ref_node_min_volume(ref_node)) &&
                    (area3 > ref_node_min_volume(ref_node));

  /* skip uv checks for meshlink */
  if (ref_geom_meshlinked(ref_geom)) {
    *allowed = normdev_allowed;
    return REF_SUCCESS;
  }

  RSS(ref_geom_uv_area_sign(ref_grid, nodes[ref_cell_node_per(ref_cell)],
                            &sign_uv_area),
      "uv area sign");

  uv_area_allowed = (sign_uv_area * uv_area2 > ref_node_min_uv_area(ref_node) &&
                     sign_uv_area * uv_area3 > ref_node_min_uv_area(ref_node));

  if (normdev_allowed && uv_area_allowed) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}